

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minicrypto.c
# Opt level: O2

int ptls_ffx_ptls_minicrypto_chacha20_b256_r8_setup(ptls_cipher_context_t *ctx,int is_enc,void *key)

{
  int iVar1;
  
  iVar1 = ptls_ffx_setup_crypto(ctx,&ptls_minicrypto_chacha20,is_enc,8,0x100,key);
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    subtest("secp256r1", test_secp256r1_key_exchange);
    subtest("x25519", test_x25519_key_exchange);
    subtest("secp256r1-sign", test_secp256r1_sign);

    ptls_iovec_t cert = ptls_iovec_init(SECP256R1_CERTIFICATE, sizeof(SECP256R1_CERTIFICATE) - 1);

    ptls_minicrypto_secp256r1sha256_sign_certificate_t sign_certificate;
    ptls_minicrypto_init_secp256r1sha256_sign_certificate(&sign_certificate,
                                                          ptls_iovec_init(SECP256R1_PRIVATE_KEY, SECP256R1_PRIVATE_KEY_SIZE));

    ptls_context_t ctxbuf = {ptls_minicrypto_random_bytes,
                             &ptls_get_time,
                             ptls_minicrypto_key_exchanges,
                             ptls_minicrypto_cipher_suites,
                             {&cert, 1},
                             NULL,
                             NULL,
                             NULL,
                             &sign_certificate.super};
    ctx = ctx_peer = &ctxbuf;
    ADD_FFX_AES128_ALGORITHMS(minicrypto);
    ADD_FFX_CHACHA20_ALGORITHMS(minicrypto);

    subtest("picotls", test_picotls);
    subtest("hrr", test_hrr);

    return done_testing();
    return done_testing();
}